

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O0

ScalarFunction * duckdb::GetLeastGreatestFunction<duckdb::LeastOp>(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunction *in_RDI;
  allocator_type *in_stack_fffffffffffffec8;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  LogicalType *local_d0;
  LogicalType local_b0 [24];
  undefined1 local_98 [32];
  LogicalType local_78 [40];
  LogicalType *local_50;
  LogicalType local_48 [24];
  LogicalType *local_30;
  undefined8 local_28;
  undefined1 local_20 [32];
  
  local_50 = local_48;
  duckdb::LogicalType::LogicalType(local_50,ANY);
  local_30 = local_48;
  local_28 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xd45079);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffee0;
  iVar1._M_array = (iterator)in_stack_fffffffffffffed8;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffee4;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffed0,iVar1,
             in_stack_fffffffffffffec8);
  duckdb::LogicalType::LogicalType(local_78,ANY);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  duckdb::LogicalType::LogicalType(local_b0,ANY);
  duckdb::ScalarFunction::ScalarFunction
            (in_RDI,local_20,local_78,local_98,BindLeastGreatest<duckdb::LeastOp>,0,0,0,local_b0,0,1
             ,0);
  duckdb::LogicalType::~LogicalType(local_b0);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xd45154);
  duckdb::LogicalType::~LogicalType(local_78);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xd4516e);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xd4517b);
  local_d0 = (LogicalType *)&local_30;
  do {
    local_d0 = local_d0 + -0x18;
    duckdb::LogicalType::~LogicalType(local_d0);
  } while (local_d0 != local_48);
  return in_RDI;
}

Assistant:

ScalarFunction GetLeastGreatestFunction() {
	return ScalarFunction({LogicalType::ANY}, LogicalType::ANY, nullptr, BindLeastGreatest<OP>, nullptr, nullptr,
	                      nullptr, LogicalType::ANY, FunctionStability::CONSISTENT,
	                      FunctionNullHandling::SPECIAL_HANDLING);
}